

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O3

int xmlTextWriterWriteDTDElement(xmlTextWriterPtr writer,xmlChar *name,xmlChar *content)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = -1;
  if (content != (xmlChar *)0x0) {
    iVar1 = xmlTextWriterStartDTDElement(writer,name);
    if (iVar1 != -1) {
      iVar2 = xmlTextWriterWriteString(writer,content);
      if (iVar2 != -1) {
        iVar3 = xmlTextWriterEndDTDElement(writer);
        if (iVar3 != -1) {
          iVar4 = iVar2 + iVar1 + iVar3;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int
xmlTextWriterWriteDTDElement(xmlTextWriterPtr writer,
                             const xmlChar * name, const xmlChar * content)
{
    int count;
    int sum;

    if (content == NULL)
        return -1;

    sum = 0;
    count = xmlTextWriterStartDTDElement(writer, name);
    if (count == -1)
        return -1;
    sum += count;

    count = xmlTextWriterWriteString(writer, content);
    if (count == -1)
        return -1;
    sum += count;

    count = xmlTextWriterEndDTDElement(writer);
    if (count == -1)
        return -1;
    sum += count;

    return sum;
}